

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp.c
# Opt level: O0

RK_S32 check_cap(vdpp2_params *params)

{
  int local_24;
  int local_20;
  RK_U32 hist_mode_check;
  RK_U32 vep_mode_check;
  RK_S32 ret_cap;
  vdpp2_params *params_local;
  
  hist_mode_check = 0;
  local_20 = 0;
  local_24 = 0;
  if (params == (vdpp2_params *)0x0) {
    if ((vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","found null pointer params\n",0);
    }
    params_local._4_4_ = 0;
  }
  else if ((params->src_height_vir < params->src_height) ||
          (params->src_width_vir < params->src_width)) {
    if ((vdpp2_debug & 4) != 0) {
      _mpp_log_l(4,"vdpp2","invalid src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
                 params->src_width,params->src_height,params->src_width_vir,params->src_height_vir);
    }
    params_local._4_4_ = 0;
  }
  else {
    if ((params->src_fmt != 0) && (params->src_fmt != 5)) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support nv12 or nv21\n",0);
      }
      local_20 = 1;
    }
    if (((((0x800 < params->src_height_vir) || (0x780 < params->src_width_vir)) ||
         (params->src_height < 0x80)) ||
        ((params->src_width < 0x80 || (params->src_height_vir < 0x80)))) ||
       (params->src_width_vir < 0x80)) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
                   params->src_width,params->src_height,params->src_width_vir,params->src_height_vir
                  );
      }
      local_20 = local_20 + 1;
    }
    if ((((0x800 < params->dst_height_vir) || (0x780 < params->dst_width_vir)) ||
        ((params->dst_height < 0x80 ||
         (((params->dst_width < 0x80 || (params->dst_height_vir < 0x80)) ||
          (params->dst_width_vir < 0x80)))))) ||
       ((params->dst_height_vir < params->dst_height || (params->dst_width_vir < params->dst_width))
       )) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
                   params->dst_width,params->dst_height,params->dst_width_vir,params->dst_height_vir
                  );
      }
      local_20 = local_20 + 1;
    }
    if (((params->src_width_vir & 0xf) != 0) || ((params->dst_width_vir & 0xf) != 0)) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support img_w_i/o_vir 16Byte align\n",0);
      }
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported src img_w_vir %d dst img_w_vir %d\n",0,
                   params->src_width_vir,params->dst_width_vir);
      }
      local_20 = local_20 + 1;
    }
    if ((params->src_height_vir & 7) != 0) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support img_h_in_vir 8pix align\n",0);
      }
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported src img_h_vir %d\n",0,params->src_height_vir);
      }
      local_20 = local_20 + 1;
    }
    if ((params->dst_height_vir & 1) != 0) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support img_h_out_vir 2pix align\n",0);
      }
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported dst img_h_vir %d\n",0,params->dst_height_vir);
      }
      local_20 = local_20 + 1;
    }
    if (((((params->src_width & 1) != 0) || ((params->src_height & 1) != 0)) ||
        ((params->dst_width & 1) != 0)) || ((params->dst_height & 1) != 0)) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep only support img_w/h_vld 2pix align\n",0);
      }
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","vep unsupported img_w_i %d img_h_i %d img_w_o %d img_h_o %d\n",0,
                   params->src_width,params->src_height,params->dst_width,params->dst_height);
      }
      local_20 = local_20 + 1;
    }
    if (params->yuv_out_diff != 0) {
      if (((((0x800 < params->dst_c_height_vir) || (0x780 < params->dst_c_width_vir)) ||
           ((params->dst_c_height < 0x80 ||
            ((params->dst_c_width < 0x80 || (params->dst_c_height_vir < 0x80)))))) ||
          (params->dst_c_width_vir < 0x80)) ||
         ((params->dst_c_height_vir < params->dst_c_height ||
          (params->dst_c_width_vir < params->dst_c_width)))) {
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","vep unsupported dst_c img_w %d img_h %d img_w_vir %d img_h_vir %d\n"
                     ,0,params->dst_c_width,params->dst_c_height,params->dst_c_width_vir,
                     params->dst_c_height_vir);
        }
        local_20 = local_20 + 1;
      }
      if ((params->dst_c_width_vir & 0xf) != 0) {
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","vep only support img_w_c_out_vir 16Byte align\n",0);
        }
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","vep unsupported dst img_w_c_vir %d\n",0,params->dst_c_width_vir);
        }
        local_20 = local_20 + 1;
      }
      if ((params->dst_c_height_vir & 1) != 0) {
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","vep only support img_h_c_out_vir 2pix align\n",0);
        }
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","vep unsupported dst img_h_vir %d\n",0,params->dst_c_height_vir);
        }
        local_20 = local_20 + 1;
      }
      if (((params->dst_c_width & 1) != 0) || ((params->dst_c_height & 1) != 0)) {
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","vep only support img_c_w/h_vld 2pix align\n",0);
        }
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","vep unsupported img_w_o %d img_h_o %d\n",0,params->dst_c_width,
                     params->dst_c_height);
        }
        local_20 = local_20 + 1;
      }
    }
    if ((((0x1000 < params->src_height_vir) || (0x1000 < params->src_width_vir)) ||
        (params->src_height < 0x80)) || (params->src_width < 0x80)) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","dci unsupported src img_w %d img_h %d img_w_vir %d img_h_vir %d\n",0,
                   params->src_width,params->src_height,params->src_width_vir,params->src_height_vir
                  );
      }
      local_24 = 1;
    }
    if (((params->src_fmt == 1) || (params->src_fmt == 3)) || (params->src_fmt == 0x11)) {
      if ((params->src_width_vir & 0xf) != 0) {
        if ((vdpp2_debug & 4) != 0) {
          _mpp_log_l(4,"vdpp2","dci Y-10bit input only support img_w_in_vir 16Byte align\n",0);
        }
        local_24 = local_24 + 1;
      }
    }
    else if ((params->src_width_vir & 3) != 0) {
      if ((vdpp2_debug & 4) != 0) {
        _mpp_log_l(4,"vdpp2","dci only support img_w_in_vir 4Byte align\n",0);
      }
      local_24 = local_24 + 1;
    }
    if ((vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","vdpp2 src img resolution: w-%d-%d, h-%d-%d\n",0,params->src_width,
                 params->src_width_vir,params->src_height,params->src_height_vir);
    }
    if ((vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","vdpp2 dst img resolution: w-%d-%d, h-%d-%d\n",0,params->dst_width,
                 params->dst_width_vir,params->dst_height,params->dst_height_vir);
    }
    if ((local_20 == 0) && (hist_mode_check = 1, (vdpp2_debug & 2) != 0)) {
      _mpp_log_l(4,"vdpp2","vdpp2 support mode: VDPP_CAP_VEP\n",0);
    }
    if (local_24 == 0) {
      if ((vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","vdpp2 support mode: VDPP_CAP_HIST\n",0);
      }
      hist_mode_check = hist_mode_check | 2;
    }
    params_local._4_4_ = hist_mode_check;
  }
  return params_local._4_4_;
}

Assistant:

static RK_S32 check_cap(struct vdpp_params *params)
{
    RK_S32 ret_cap = VDPP_CAP_UNSUPPORTED;
    RK_U32 vep_mode_check = 0;

    if (NULL == params) {
        VDPP_DBG(VDPP_DBG_CHECK, "found null pointer params\n");
        return VDPP_CAP_UNSUPPORTED;
    }

    if ((params->src_height < VDPP_MODE_MIN_HEIGHT) ||
        (params->src_width < VDPP_MODE_MIN_WIDTH)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep src unsupported img_w %d img_h %d\n",
                 params->src_height, params->src_width);
        vep_mode_check++;
    }

    if ((params->dst_height < VDPP_MODE_MIN_HEIGHT) ||
        (params->dst_width < VDPP_MODE_MIN_WIDTH)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep dst unsupported img_w %d img_h %d\n",
                 params->dst_height, params->dst_width);
        vep_mode_check++;
    }

    if ((params->src_width & 1) || (params->src_height & 1) ||
        (params->dst_width & 1) || (params->dst_height & 1)) {
        VDPP_DBG(VDPP_DBG_CHECK, "vep only support img_w/h_vld 2pix align\n");
        VDPP_DBG(VDPP_DBG_CHECK, "vep unsupported img_w_i %d img_h_i %d img_w_o %d img_h_o %d\n",
                 params->src_width, params->src_height, params->dst_width, params->dst_height);
        vep_mode_check++;
    }

    if (!vep_mode_check) {
        ret_cap |= VDPP_CAP_VEP;
        VDPP_DBG(VDPP_DBG_INT, "vdpp support mode: VDPP_CAP_VEP\n");
    }

    return ret_cap;
}